

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

FStateDefine * __thiscall FStateDefinitions::FindStateAddress(FStateDefinitions *this,char *name)

{
  uint uVar1;
  FStateDefinitions *list;
  uint uVar2;
  FName *other;
  FName local_38;
  uint local_34;
  FStateDefinitions *pFStack_30;
  uint i;
  TArray<FStateDefine,_FStateDefine> *statelist;
  TArray<FName,_FName> *namelist;
  FStateDefine *statedef;
  char *name_local;
  FStateDefinitions *this_local;
  
  namelist = (TArray<FName,_FName> *)0x0;
  statedef = (FStateDefine *)name;
  name_local = (char *)this;
  statelist = (TArray<FStateDefine,_FStateDefine> *)MakeStateNameList(name);
  local_34 = 0;
  pFStack_30 = this;
  while( true ) {
    uVar1 = local_34;
    uVar2 = TArray<FName,_FName>::Size((TArray<FName,_FName> *)statelist);
    list = pFStack_30;
    if (uVar2 <= uVar1) break;
    other = TArray<FName,_FName>::operator[]((TArray<FName,_FName> *)statelist,(ulong)local_34);
    FName::FName(&local_38,other);
    namelist = (TArray<FName,_FName> *)FindStateLabelInList(&list->StateLabels,&local_38,true);
    pFStack_30 = (FStateDefinitions *)&((FStateDefine *)namelist)->Children;
    local_34 = local_34 + 1;
  }
  return (FStateDefine *)namelist;
}

Assistant:

FStateDefine *FStateDefinitions::FindStateAddress(const char *name)
{
	FStateDefine *statedef = NULL;
	TArray<FName> &namelist = MakeStateNameList(name);
	TArray<FStateDefine> *statelist = &StateLabels;

	for(unsigned i = 0; i < namelist.Size(); i++)
	{
		statedef = FindStateLabelInList(*statelist, namelist[i], true);
		statelist = &statedef->Children;
	}
	return statedef;
}